

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

void Wlc_PrsStop(Wlc_Prs_t *p)

{
  char *__ptr;
  void **__ptr_00;
  Vec_Int_t *pVVar1;
  
  if (p->pNtk != (Wlc_Ntk_t *)0x0) {
    Wlc_NtkFree(p->pNtk);
  }
  if (p->pMemTable != (Mem_Flex_t *)0x0) {
    Mem_FlexStop(p->pMemTable,0);
  }
  if (p->vPoPairs != (Vec_Str_t *)0x0) {
    __ptr = p->vPoPairs->pArray;
    if (__ptr != (char *)0x0) {
      free(__ptr);
      p->vPoPairs->pArray = (char *)0x0;
    }
    if (p->vPoPairs != (Vec_Str_t *)0x0) {
      free(p->vPoPairs);
      p->vPoPairs = (Vec_Str_t *)0x0;
    }
  }
  if (p->vTables != (Vec_Ptr_t *)0x0) {
    __ptr_00 = p->vTables->pArray;
    if (__ptr_00 != (void **)0x0) {
      free(__ptr_00);
      p->vTables->pArray = (void **)0x0;
    }
    if (p->vTables != (Vec_Ptr_t *)0x0) {
      free(p->vTables);
      p->vTables = (Vec_Ptr_t *)0x0;
    }
  }
  pVVar1 = p->vLines;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vStarts;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vFanins;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  if (p != (Wlc_Prs_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Wlc_PrsStop( Wlc_Prs_t * p )
{
    if ( p->pNtk )
        Wlc_NtkFree( p->pNtk );
    if ( p->pMemTable )
        Mem_FlexStop( p->pMemTable, 0 );
    Vec_StrFreeP( &p->vPoPairs );
    Vec_PtrFreeP( &p->vTables );
    Vec_IntFree( p->vLines );
    Vec_IntFree( p->vStarts );
    Vec_IntFree( p->vFanins );
    ABC_FREE( p->pBuffer );
    ABC_FREE( p );
}